

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene-access.cc
# Opt level: O3

expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
tinyusdz::tydra::anon_unknown_6::GetPrimProperty<tinyusdz::UsdPreviewSurface>
          (expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,UsdPreviewSurface *surface,string *prop_name,Property *out_prop)

{
  size_type *psVar1;
  bool *pbVar2;
  char cVar3;
  char *pcVar4;
  expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *peVar5;
  bool bVar6;
  int iVar7;
  undefined8 uVar8;
  Property *pPVar9;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  undefined7 extraout_var_01;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  undefined7 extraout_var_02;
  undefined7 extraout_var_03;
  Property *extraout_RAX_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX_01;
  undefined7 extraout_var_04;
  undefined7 extraout_var_05;
  undefined7 extraout_var_06;
  undefined7 extraout_var_07;
  undefined7 extraout_var_08;
  undefined7 extraout_var_09;
  undefined7 extraout_var_10;
  undefined7 extraout_var_11;
  Property *extraout_RAX_02;
  Property *extraout_RAX_03;
  string *in;
  long lVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  AttrMetas *pAVar11;
  ulong uVar12;
  Animatable<int> v;
  string err;
  TimeSamples ts;
  undefined8 local_950;
  TypedTimeSamples<int> local_948;
  string local_928;
  AttrMetas *local_908;
  expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_900;
  storage_union local_8f8;
  undefined1 uStack_8e8;
  undefined7 uStack_8e7;
  undefined1 uStack_8e0;
  undefined1 local_8d0 [40];
  _Alloc_hider local_8a8;
  size_type local_8a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_898;
  storage_union local_888;
  vtable_type *local_878;
  bool local_870;
  undefined1 local_868 [32];
  undefined1 local_848 [24];
  AttrMetas AStack_830;
  storage_union local_628;
  undefined1 *local_618;
  storage_union local_610;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_600;
  undefined1 local_5f0 [9];
  undefined7 uStack_5e7;
  undefined1 uStack_5e0;
  undefined8 uStack_5df;
  undefined4 local_364;
  undefined1 local_38;
  
  local_928._M_dataplus._M_p = (pointer)&local_928.field_2;
  local_928._M_string_length = 0;
  local_928.field_2._M_local_buf[0] = '\0';
  iVar7 = ::std::__cxx11::string::compare((char *)prop_name);
  if (iVar7 == 0) {
    bVar6 = ToProperty<tinyusdz::value::color3f>(&surface->diffuseColor,out_prop,&local_928);
    pPVar9 = (Property *)CONCAT71(extraout_var,bVar6);
    if (!bVar6) {
      local_950 = &local_948._samples.
                   super__Vector_base<tinyusdz::TypedTimeSamples<int>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<int>::Sample>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_950,"Convert Property {} failed: {}\n","");
      pcVar4 = "inputs:diffuseColor";
LAB_00327a35:
      fmt::format<char[13],std::__cxx11::string>
                ((string *)local_8d0,(fmt *)&local_950,(string *)(pcVar4 + 7),
                 (char (*) [13])&local_928,in_R8);
      goto LAB_00327b02;
    }
    goto LAB_00328172;
  }
  iVar7 = ::std::__cxx11::string::compare((char *)prop_name);
  if (iVar7 == 0) {
    bVar6 = ToProperty<tinyusdz::value::color3f>(&surface->emissiveColor,out_prop,&local_928);
    pPVar9 = (Property *)CONCAT71(extraout_var_00,bVar6);
    if (bVar6) goto LAB_00328172;
    local_950 = &local_948._samples.
                 super__Vector_base<tinyusdz::TypedTimeSamples<int>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<int>::Sample>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_950,"Convert Property {} failed: {}\n","");
    pcVar4 = "inputs:emissiveColor";
LAB_00327aea:
    fmt::format<char[14],std::__cxx11::string>
              ((string *)local_8d0,(fmt *)&local_950,(string *)(pcVar4 + 7),
               (char (*) [14])&local_928,in_R8);
LAB_00327b02:
    uVar8 = &local_600;
    if ((undefined1 *)local_8d0._0_8_ == local_8d0 + 0x10) {
      local_600._8_8_ = local_8d0._24_8_;
      local_8d0._0_8_ = uVar8;
    }
    local_600._M_allocated_capacity._1_7_ = local_8d0._17_7_;
    local_600._M_local_buf[0] = local_8d0[0x10];
    (__return_storage_ptr__->contained).
    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .m_has_value = false;
    psVar1 = (size_type *)
             ((long)&(__return_storage_ptr__->contained).
                     super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     .field_0 + 0x10);
    *(size_type **)
     &(__return_storage_ptr__->contained).
      super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .field_0 = psVar1;
    if (local_8d0._0_8_ == uVar8) {
      *psVar1 = local_600._M_allocated_capacity;
      *(size_type *)
       ((long)&(__return_storage_ptr__->contained).
               super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               .field_0 + 0x18) = local_600._8_8_;
    }
    else {
      (__return_storage_ptr__->contained).
      super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .field_0.m_error._M_dataplus._M_p = (pointer)local_8d0._0_8_;
      *(size_type *)
       ((long)&(__return_storage_ptr__->contained).
               super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               .field_0 + 0x10) = local_600._M_allocated_capacity;
    }
    (__return_storage_ptr__->contained).
    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .field_0.m_error._M_string_length = local_8d0._8_8_;
LAB_00327b98:
    local_610.dynamic = &local_600;
    local_8d0._0_8_ = local_8d0 + 0x10;
    local_8d0[0x10] = '\0';
    local_8d0._8_8_ = 0;
    local_610._8_8_ = 0;
    local_600._M_allocated_capacity = local_600._M_allocated_capacity & 0xffffffffffffff00;
    if (local_950 !=
        &local_948._samples.
         super__Vector_base<tinyusdz::TypedTimeSamples<int>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<int>::Sample>_>
         ._M_impl.super__Vector_impl_data._M_finish) {
      operator_delete(local_950,
                      (ulong)((long)&(local_948._samples.
                                      super__Vector_base<tinyusdz::TypedTimeSamples<int>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<int>::Sample>_>
                                      ._M_impl.super__Vector_impl_data._M_finish)->t + 1));
      uVar8 = extraout_RAX;
    }
  }
  else {
    iVar7 = ::std::__cxx11::string::compare((char *)prop_name);
    if (iVar7 == 0) {
      bVar6 = ToProperty<tinyusdz::value::color3f>(&surface->specularColor,out_prop,&local_928);
      pPVar9 = (Property *)CONCAT71(extraout_var_01,bVar6);
      if (!bVar6) {
        local_950 = &local_948._samples.
                     super__Vector_base<tinyusdz::TypedTimeSamples<int>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<int>::Sample>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_950,"Convert Property {} failed: {}\n","");
        pcVar4 = "inputs:specularColor";
        goto LAB_00327aea;
      }
      goto LAB_00328172;
    }
    iVar7 = ::std::__cxx11::string::compare((char *)prop_name);
    if (iVar7 == 0) {
      local_8d0._0_8_ = local_8d0 + 0x10;
      local_8d0._8_8_ = 0;
      local_8d0[0x10] = '\0';
      local_8d0[0x24] = false;
      local_8a8._M_p = local_8d0 + 0x38;
      local_8a0 = 0;
      local_898._M_local_buf[0] = '\0';
      local_878 = (vtable_type *)&linb::any::vtable_for_type<decltype(nullptr)>()::table;
      local_888.dynamic = (void *)0x0;
      local_870 = false;
      local_868._0_8_ = (pointer)0x0;
      local_868[8] = 0;
      local_868._9_7_ = 0;
      local_868[0x10] = 0;
      local_868._17_8_ = 0;
      AStack_830.interpolation.contained = (storage_t<tinyusdz::Interpolation>)0x0;
      AStack_830.elementSize.has_value_ = false;
      AStack_830.elementSize.contained = (storage_t<unsigned_int>)0x0;
      AStack_830.hidden.has_value_ = false;
      AStack_830.hidden.contained = (storage_t<bool>)0x0;
      AStack_830.comment.has_value_ = false;
      AStack_830.weight.contained = (storage_t<double>)0x0;
      AStack_830.connectability.has_value_ = false;
      AStack_830.bindMaterialAs.contained.data._16_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      AStack_830.bindMaterialAs.contained._24_8_ = 0;
      AStack_830.bindMaterialAs.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
      AStack_830.bindMaterialAs.contained._8_8_ = 0;
      AStack_830.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           (_Base_ptr)(local_8d0 + 0x268);
      AStack_830.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      AStack_830.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      AStack_830.comment.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
      AStack_830.comment.contained._8_8_ = 0;
      AStack_830.comment.contained.data._16_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      AStack_830.comment.contained._24_8_ = 0;
      AStack_830.comment.contained._32_8_ = 0;
      AStack_830.comment.contained._40_8_ = 0;
      AStack_830.customData.has_value_ = false;
      AStack_830.customData.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
      AStack_830.customData.contained._8_8_ = 0;
      AStack_830.customData.contained.data._16_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      AStack_830.customData.contained._24_8_ = 0;
      AStack_830.customData.contained._32_8_ = 0;
      AStack_830.customData.contained._40_8_ = 0;
      AStack_830.weight.has_value_ = false;
      AStack_830.connectability.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
      AStack_830.connectability.contained._8_8_ = 0;
      AStack_830.connectability.contained.data._16_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      AStack_830.connectability.contained._24_8_ = 0;
      AStack_830.outputName.has_value_ = false;
      AStack_830.outputName.contained._0_8_ = 0;
      AStack_830.outputName.contained._8_8_ = 0;
      AStack_830.outputName.contained.data._16_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      AStack_830.outputName.contained._24_8_ = 0;
      AStack_830.renderType.has_value_ = false;
      AStack_830.sdrMetadata.has_value_ = false;
      AStack_830.renderType.contained.data._16_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      AStack_830.renderType.contained._24_8_ = 0;
      AStack_830.renderType.contained._0_8_ = 0;
      AStack_830.renderType.contained._8_8_ = 0;
      AStack_830.displayName.has_value_ = false;
      AStack_830.sdrMetadata.contained._32_8_ = 0;
      AStack_830.sdrMetadata.contained._40_8_ = 0;
      AStack_830.sdrMetadata.contained.data._16_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      AStack_830.sdrMetadata.contained._24_8_ = 0;
      AStack_830.sdrMetadata.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
      AStack_830.sdrMetadata.contained._8_8_ = 0;
      AStack_830.displayGroup.has_value_ = false;
      AStack_830.displayName.contained.data._16_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      AStack_830.displayName.contained._24_8_ = 0;
      AStack_830.displayName.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
      AStack_830.displayName.contained._8_8_ = 0;
      AStack_830.bindMaterialAs.has_value_ = false;
      AStack_830.displayGroup.contained.data._16_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      AStack_830.displayGroup.contained._24_8_ = 0;
      AStack_830.displayGroup.contained._0_8_ = 0;
      AStack_830.displayGroup.contained._8_8_ = 0;
      local_848[0x10] = 0;
      stack0xfffffffffffff7c9 = 0;
      local_848._0_8_ = (pointer)0x0;
      local_848[8] = 0;
      local_848._9_7_ = 0;
      AStack_830.meta._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      AStack_830.stringData.
      super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      AStack_830.stringData.
      super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      AStack_830.stringData.
      super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_8d0._32_4_ = Varying;
      local_600._M_allocated_capacity._0_4_ = 0x746e69;
      local_610._8_8_ = 3;
      local_900 = __return_storage_ptr__;
      AStack_830.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           AStack_830.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      local_610.dynamic = &local_600;
      ::std::__cxx11::string::_M_assign((string *)(local_8d0 + 0x28));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_610.dynamic != &local_600) {
        operator_delete(local_610.dynamic,local_600._M_allocated_capacity + 1);
      }
      if ((surface->useSpecularWorkflow)._blocked == true) {
        local_870 = true;
      }
      if ((surface->useSpecularWorkflow)._paths.
          super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          (surface->useSpecularWorkflow)._paths.
          super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
          super__Vector_impl_data._M_start) {
        std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                  ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)(local_8d0 + 0x88),
                   (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                   &(surface->useSpecularWorkflow)._paths);
      }
      lVar10 = 600;
      if ((surface->useSpecularWorkflow)._attrib.has_value_ != false) {
        lVar10 = 0x228;
      }
      pbVar2 = &(surface->useSpecularWorkflow)._metas.interpolation.has_value_ + lVar10;
      local_950 = (pointer *)
                  CONCAT44(CONCAT22(local_950._6_2_,*(undefined2 *)(pbVar2 + 4)),
                           *(undefined4 *)pbVar2);
      local_908 = &(surface->useSpecularWorkflow)._metas;
      ::std::
      vector<tinyusdz::TypedTimeSamples<int>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<int>::Sample>_>
      ::vector(&local_948._samples,
               (vector<tinyusdz::TypedTimeSamples<int>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<int>::Sample>_>
                *)(pbVar2 + 8));
      local_948._dirty =
           *(bool *)((long)&(surface->useSpecularWorkflow)._metas.comment.contained + lVar10);
      local_600._M_allocated_capacity =
           (size_type)&linb::any::vtable_for_type<decltype(nullptr)>()::table;
      local_610.dynamic =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
      local_600._8_8_ = local_600._8_8_ & 0xffffffffffffff00;
      local_5f0._0_8_ = (pointer)0x0;
      local_5f0[8] = 0;
      uStack_5e7 = 0;
      uStack_5e0 = 0;
      uStack_5df = 0;
      if (local_948._dirty == true) {
        TypedTimeSamples<int>::update(&local_948);
      }
      if (local_948._samples.
          super__Vector_base<tinyusdz::TypedTimeSamples<int>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<int>::Sample>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          local_948._samples.
          super__Vector_base<tinyusdz::TypedTimeSamples<int>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<int>::Sample>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        if (local_948._dirty == true) {
          TypedTimeSamples<int>::update(&local_948);
        }
        uStack_8e8 = 0;
        uStack_8e7 = 0;
        uStack_8e0 = 0;
        local_8f8.dynamic = (void *)0x0;
        local_8f8._8_1_ = 0;
        local_8f8._9_7_ = 0;
        if (local_948._samples.
            super__Vector_base<tinyusdz::TypedTimeSamples<int>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<int>::Sample>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            local_948._samples.
            super__Vector_base<tinyusdz::TypedTimeSamples<int>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<int>::Sample>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          lVar10 = 8;
          uVar12 = 0;
          do {
            local_618 = linb::any::vtable_for_type<int>()::table;
            local_628._0_4_ =
                 *(undefined4 *)
                  ((long)&(local_948._samples.
                           super__Vector_base<tinyusdz::TypedTimeSamples<int>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<int>::Sample>_>
                           ._M_impl.super__Vector_impl_data._M_start)->t + lVar10);
            tinyusdz::value::TimeSamples::add_sample
                      ((TimeSamples *)&local_8f8,
                       *(double *)
                        ((long)local_948._samples.
                               super__Vector_base<tinyusdz::TypedTimeSamples<int>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<int>::Sample>_>
                               ._M_impl.super__Vector_impl_data._M_start + lVar10 + -8),
                       (Value *)&local_628);
            if (local_618 != (undefined1 *)0x0) {
              (**(code **)(local_618 + 0x20))(&local_628);
            }
            uVar12 = uVar12 + 1;
            lVar10 = lVar10 + 0x10;
          } while (uVar12 < (ulong)((long)local_948._samples.
                                          super__Vector_base<tinyusdz::TypedTimeSamples<int>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<int>::Sample>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)local_948._samples.
                                          super__Vector_base<tinyusdz::TypedTimeSamples<int>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<int>::Sample>_>
                                          ._M_impl.super__Vector_impl_data._M_start >> 4));
        }
        ::std::
        vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
        ::operator=((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                     *)local_5f0,
                    (vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                     *)&local_8f8);
        uStack_5df = CONCAT17(uStack_8e0,(undefined7)uStack_5df);
        ::std::
        vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
        ::~vector((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                   *)&local_8f8);
      }
      pAVar11 = local_908;
      if (local_950._4_1_ == '\x01') {
        if (local_950._5_1_ == '\0') {
          uStack_8e8 = 0x68;
          uStack_8e7 = 0x45cf;
          local_8f8._0_4_ = (undefined4)local_950;
          linb::any::operator=((any *)&local_610,(any *)&local_8f8);
          if (CONCAT71(uStack_8e7,uStack_8e8) != 0) {
            (**(code **)(CONCAT71(uStack_8e7,uStack_8e8) + 0x20))(&local_8f8);
          }
          goto LAB_00328046;
        }
        ::std::__cxx11::string::append((char *)&local_928);
        bVar6 = false;
      }
      else {
LAB_00328046:
        pAVar11 = local_908;
        Attribute::set_var((Attribute *)local_8d0,(PrimVar *)&local_610);
        bVar6 = true;
      }
      ::std::
      vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
      ::~vector((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                 *)local_5f0);
      if ((undefined8 *)local_600._M_allocated_capacity != (undefined8 *)0x0) {
        (**(code **)(local_600._M_allocated_capacity + 0x20))(&local_610);
      }
      if (local_948._samples.
          super__Vector_base<tinyusdz::TypedTimeSamples<int>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<int>::Sample>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_948._samples.
                        super__Vector_base<tinyusdz::TypedTimeSamples<int>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<int>::Sample>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_948._samples.
                              super__Vector_base<tinyusdz::TypedTimeSamples<int>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<int>::Sample>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_948._samples.
                              super__Vector_base<tinyusdz::TypedTimeSamples<int>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<int>::Sample>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (bVar6) {
        AttrMetas::operator=((AttrMetas *)(local_8d0 + 0xa0),pAVar11);
        Property::Property((Property *)&local_610,(Attribute *)local_8d0,false);
        Property::operator=(out_prop,(Property *)&local_610);
        Property::~Property((Property *)&local_610);
      }
      AttrMetas::~AttrMetas((AttrMetas *)(local_8d0 + 0xa0));
      ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector
                ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)(local_8d0 + 0x88));
      ::std::
      vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
      ::~vector((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                 *)(local_8d0 + 0x68));
      if (local_878 != (vtable_type *)0x0) {
        (*local_878->destroy)((storage_union *)(local_8d0 + 0x48));
        local_878 = (vtable_type *)0x0;
      }
      if (local_8a8._M_p != local_8d0 + 0x38) {
        operator_delete(local_8a8._M_p,
                        CONCAT71(local_898._M_allocated_capacity._1_7_,local_898._M_local_buf[0]) +
                        1);
      }
      pPVar9 = (Property *)(local_8d0 + 0x10);
      if ((Property *)local_8d0._0_8_ != pPVar9) {
        operator_delete((void *)local_8d0._0_8_,CONCAT71(local_8d0._17_7_,local_8d0[0x10]) + 1);
        pPVar9 = extraout_RAX_00;
      }
      peVar5 = local_900;
      __return_storage_ptr__ = local_900;
      if (!bVar6) {
        local_950 = &local_948._samples.
                     super__Vector_base<tinyusdz::TypedTimeSamples<int>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<int>::Sample>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_950,"Convert Property {} failed: {}\n","");
        fmt::format<char[20],std::__cxx11::string>
                  ((string *)local_8d0,(fmt *)&local_950,(string *)0x3deb5f,
                   (char (*) [20])&local_928,in_R8);
        uVar8 = local_8d0._0_8_;
        if ((undefined1 *)local_8d0._0_8_ == local_8d0 + 0x10) {
          local_600._8_8_ = local_8d0._24_8_;
          uVar8 = &local_600;
        }
        local_600._M_allocated_capacity._1_7_ = local_8d0._17_7_;
        local_600._M_local_buf[0] = local_8d0[0x10];
        (peVar5->contained).
        super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .m_has_value = false;
        psVar1 = (size_type *)
                 ((long)&(peVar5->contained).
                         super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         .field_0 + 0x10);
        *(size_type **)
         &(peVar5->contained).
          super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .field_0 = psVar1;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)uVar8 == &local_600) {
          *psVar1 = local_600._M_allocated_capacity;
          *(size_type *)
           ((long)&(peVar5->contained).
                   super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   .field_0 + 0x18) = local_600._8_8_;
        }
        else {
          (peVar5->contained).
          super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .field_0.m_error._M_dataplus._M_p = (pointer)uVar8;
          *(size_type *)
           ((long)&(peVar5->contained).
                   super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   .field_0 + 0x10) = local_600._M_allocated_capacity;
          uVar8 = local_600._M_allocated_capacity;
        }
        (peVar5->contained).
        super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .field_0.m_error._M_string_length = local_8d0._8_8_;
        goto LAB_00327b98;
      }
    }
    else {
      iVar7 = ::std::__cxx11::string::compare((char *)prop_name);
      if (iVar7 == 0) {
        bVar6 = ToProperty<float>(&surface->metallic,out_prop,&local_928);
        pPVar9 = (Property *)CONCAT71(extraout_var_02,bVar6);
        if (!bVar6) {
          local_950 = &local_948._samples.
                       super__Vector_base<tinyusdz::TypedTimeSamples<int>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<int>::Sample>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_950,"Convert Property {} failed: {}\n","");
          fmt::format<char[9],std::__cxx11::string>
                    ((string *)local_8d0,(fmt *)&local_950,(string *)0x3deac0,
                     (char (*) [9])&local_928,in_R8);
          goto LAB_00327b02;
        }
      }
      else {
        iVar7 = ::std::__cxx11::string::compare((char *)prop_name);
        if (iVar7 == 0) {
          bVar6 = ToProperty<float>(&surface->clearcoat,out_prop,&local_928);
          pPVar9 = (Property *)CONCAT71(extraout_var_03,bVar6);
          if (!bVar6) {
            local_950 = &local_948._samples.
                         super__Vector_base<tinyusdz::TypedTimeSamples<int>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<int>::Sample>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_950,"Convert Property {} failed: {}\n","");
            in = (string *)0x3dead0;
LAB_0032833f:
            fmt::format<char[10],std::__cxx11::string>
                      ((string *)local_8d0,(fmt *)&local_950,in,(char (*) [10])&local_928,in_R8);
            goto LAB_00327b02;
          }
        }
        else {
          iVar7 = ::std::__cxx11::string::compare((char *)prop_name);
          if (iVar7 == 0) {
            bVar6 = ToProperty<float>(&surface->clearcoatRoughness,out_prop,&local_928);
            pPVar9 = (Property *)CONCAT71(extraout_var_04,bVar6);
            if (!bVar6) {
              local_950 = &local_948._samples.
                           super__Vector_base<tinyusdz::TypedTimeSamples<int>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<int>::Sample>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_950,"Convert Property {} failed: {}\n","");
              fmt::format<char[19],std::__cxx11::string>
                        ((string *)local_8d0,(fmt *)&local_950,(string *)0x3deae1,
                         (char (*) [19])&local_928,in_R8);
              goto LAB_00327b02;
            }
          }
          else {
            iVar7 = ::std::__cxx11::string::compare((char *)prop_name);
            if (iVar7 == 0) {
              bVar6 = ToProperty<float>(&surface->roughness,out_prop,&local_928);
              pPVar9 = (Property *)CONCAT71(extraout_var_05,bVar6);
              if (!bVar6) {
                local_950 = &local_948._samples.
                             super__Vector_base<tinyusdz::TypedTimeSamples<int>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<int>::Sample>_>
                             ._M_impl.super__Vector_impl_data._M_finish;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_950,"Convert Property {} failed: {}\n","");
                in = (string *)0x3dea9a;
                goto LAB_0032833f;
              }
            }
            else {
              iVar7 = ::std::__cxx11::string::compare((char *)prop_name);
              if (iVar7 == 0) {
                bVar6 = ToProperty<float>(&surface->opacity,out_prop,&local_928);
                pPVar9 = (Property *)CONCAT71(extraout_var_06,bVar6);
                if (!bVar6) {
                  local_950 = &local_948._samples.
                               super__Vector_base<tinyusdz::TypedTimeSamples<int>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<int>::Sample>_>
                               ._M_impl.super__Vector_impl_data._M_finish;
                  ::std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_950,"Convert Property {} failed: {}\n","");
                  fmt::format<char[8],std::__cxx11::string>
                            ((string *)local_8d0,(fmt *)&local_950,(string *)0x3deafb,
                             (char (*) [8])&local_928,in_R8);
                  goto LAB_00327b02;
                }
              }
              else {
                iVar7 = ::std::__cxx11::string::compare((char *)prop_name);
                if (iVar7 == 0) {
                  bVar6 = ToProperty<float>(&surface->opacityThreshold,out_prop,&local_928);
                  pPVar9 = (Property *)CONCAT71(extraout_var_07,bVar6);
                  if (!bVar6) {
                    local_950 = &local_948._samples.
                                 super__Vector_base<tinyusdz::TypedTimeSamples<int>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<int>::Sample>_>
                                 ._M_impl.super__Vector_impl_data._M_finish;
                    ::std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_950,"Convert Property {} failed: {}\n","");
                    fmt::format<char[17],std::__cxx11::string>
                              ((string *)local_8d0,(fmt *)&local_950,(string *)0x3deb0a,
                               (char (*) [17])&local_928,in_R8);
                    goto LAB_00327b02;
                  }
                }
                else {
                  iVar7 = ::std::__cxx11::string::compare((char *)prop_name);
                  if (iVar7 == 0) {
                    bVar6 = ToProperty<float>(&surface->ior,out_prop,&local_928);
                    pPVar9 = (Property *)CONCAT71(extraout_var_08,bVar6);
                    if (!bVar6) {
                      local_950 = &local_948._samples.
                                   super__Vector_base<tinyusdz::TypedTimeSamples<int>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<int>::Sample>_>
                                   ._M_impl.super__Vector_impl_data._M_finish;
                      ::std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_950,"Convert Property {} failed: {}\n","");
                      fmt::format<char[4],std::__cxx11::string>
                                ((string *)local_8d0,(fmt *)&local_950,(string *)0x3deb22,
                                 (char (*) [4])&local_928,in_R8);
                      goto LAB_00327b02;
                    }
                  }
                  else {
                    iVar7 = ::std::__cxx11::string::compare((char *)prop_name);
                    if (iVar7 == 0) {
                      bVar6 = ToProperty<tinyusdz::value::normal3f>
                                        (&surface->normal,out_prop,&local_928);
                      pPVar9 = (Property *)CONCAT71(extraout_var_09,bVar6);
                      if (!bVar6) {
                        local_950 = &local_948._samples.
                                     super__Vector_base<tinyusdz::TypedTimeSamples<int>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<int>::Sample>_>
                                     ._M_impl.super__Vector_impl_data._M_finish;
                        ::std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)&local_950,"Convert Property {} failed: {}\n","");
                        fmt::format<char[7],std::__cxx11::string>
                                  ((string *)local_8d0,(fmt *)&local_950,(string *)0x3deb2d,
                                   (char (*) [7])&local_928,in_R8);
                        goto LAB_00327b02;
                      }
                    }
                    else {
                      iVar7 = ::std::__cxx11::string::compare((char *)prop_name);
                      if (iVar7 == 0) {
                        bVar6 = ToProperty<float>(&surface->displacement,out_prop,&local_928);
                        pPVar9 = (Property *)CONCAT71(extraout_var_10,bVar6);
                        if (!bVar6) {
                          local_950 = &local_948._samples.
                                       super__Vector_base<tinyusdz::TypedTimeSamples<int>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<int>::Sample>_>
                                       ._M_impl.super__Vector_impl_data._M_finish;
                          ::std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)&local_950,"Convert Property {} failed: {}\n","");
                          pcVar4 = "inputs:displacement";
                          goto LAB_00327a35;
                        }
                      }
                      else {
                        iVar7 = ::std::__cxx11::string::compare((char *)prop_name);
                        if (iVar7 != 0) {
                          uVar8 = ::std::__cxx11::string::compare((char *)prop_name);
                          if ((int)uVar8 == 0) {
                            cVar3 = (surface->outputsSurface)._authored;
joined_r0x003285a4:
                            if (cVar3 == '\x01') {
                              local_8d0._0_8_ = local_8d0 + 0x10;
                              ::std::__cxx11::string::_M_construct<char_const*>
                                        ((string *)local_8d0,"token","");
                              Property::Property((Property *)&local_610);
                              local_38 = 0;
                              local_364 = 0;
                              ::std::__cxx11::string::_M_assign((string *)(local_5f0 + 8));
                              Property::operator=(out_prop,(Property *)&local_610);
                              Property::~Property((Property *)&local_610);
                              pPVar9 = extraout_RAX_02;
                              if ((undefined1 *)local_8d0._0_8_ != local_8d0 + 0x10) {
                                operator_delete((void *)local_8d0._0_8_,
                                                CONCAT71(local_8d0._17_7_,local_8d0[0x10]) + 1);
                                pPVar9 = extraout_RAX_03;
                              }
                              goto LAB_00328172;
                            }
                          }
                          else {
                            uVar8 = ::std::__cxx11::string::compare((char *)prop_name);
                            if ((int)uVar8 == 0) {
                              cVar3 = (surface->outputsDisplacement)._authored;
                              goto joined_r0x003285a4;
                            }
                            uVar8 = ::std::
                                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                                    ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                                            *)&(surface->super_ShaderNode).super_UsdShadePrim.props,
                                           prop_name);
                            if ((_Rb_tree_header *)uVar8 !=
                                &(surface->super_ShaderNode).super_UsdShadePrim.props._M_t._M_impl.
                                 super__Rb_tree_header) {
                              pPVar9 = Property::operator=(out_prop,(Property *)(uVar8 + 0x40));
                              goto LAB_00328172;
                            }
                          }
                          (__return_storage_ptr__->contained).
                          super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          .m_has_value = true;
                          (__return_storage_ptr__->contained).
                          super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          .field_0.m_value = false;
                          goto LAB_0032817a;
                        }
                        bVar6 = ToProperty<float>(&surface->occlusion,out_prop,&local_928);
                        pPVar9 = (Property *)CONCAT71(extraout_var_11,bVar6);
                        if (!bVar6) {
                          local_950 = &local_948._samples.
                                       super__Vector_base<tinyusdz::TypedTimeSamples<int>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<int>::Sample>_>
                                       ._M_impl.super__Vector_impl_data._M_finish;
                          ::std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)&local_950,"Convert Property {} failed: {}\n","");
                          in = (string *)0x3deb4e;
                          goto LAB_0032833f;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
LAB_00328172:
    uVar8 = CONCAT71((int7)((ulong)pPVar9 >> 8),1);
    (__return_storage_ptr__->contained).
    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .m_has_value = true;
    (__return_storage_ptr__->contained).
    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .field_0.m_value = true;
  }
LAB_0032817a:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_928._M_dataplus._M_p != &local_928.field_2) {
    operator_delete(local_928._M_dataplus._M_p,
                    CONCAT71(local_928.field_2._M_allocated_capacity._1_7_,
                             local_928.field_2._M_local_buf[0]) + 1);
    uVar8 = extraout_RAX_01;
  }
  return (expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)uVar8;
}

Assistant:

nonstd::expected<bool, std::string> GetPrimProperty(
    const UsdPreviewSurface &surface, const std::string &prop_name,
    Property *out_prop) {
  if (!out_prop) {
    return nonstd::make_unexpected(
        "[InternalError] nullptr in output Property is not allowed.");
  }

  DCOUT("prop_name = " << prop_name);
  std::string err;

  TO_PROPERTY("diffuseColor", surface.diffuseColor)
  TO_PROPERTY("emissiveColor", surface.emissiveColor)
  TO_PROPERTY("specularColor", surface.specularColor)
  TO_PROPERTY("useSpecularWorkflow", surface.useSpecularWorkflow)
  TO_PROPERTY("metallic", surface.metallic)
  TO_PROPERTY("clearcoat", surface.clearcoat)
  TO_PROPERTY("clearcoatRoughness", surface.clearcoatRoughness)
  TO_PROPERTY("roughness", surface.roughness)
  TO_PROPERTY("opacity", surface.opacity)
  TO_PROPERTY("opacityThreshold", surface.opacityThreshold)
  TO_PROPERTY("ior", surface.ior)
  TO_PROPERTY("normal", surface.normal)
  TO_PROPERTY("displacement", surface.displacement)
  TO_PROPERTY("occlusion", surface.occlusion)

  if (prop_name == "outputs:surface") {
    if (surface.outputsSurface.authored()) {
      // empty. type info only
      (*out_prop) =
          Property::MakeEmptyAttrib(value::kToken, /* custom */ false);
    } else {
      // Not authored
      return false;
    }
  } else if (prop_name == "outputs:displacement") {
    if (surface.outputsDisplacement.authored()) {
      // empty. type info only
      (*out_prop) =
          Property::MakeEmptyAttrib(value::kToken, /* custom */ false);
    } else {
      // Not authored
      return false;
    }
  } else {
    const auto it = surface.props.find(prop_name);
    if (it == surface.props.end()) {
      // Attribute not found.
      // TODO: report warn?
      return false;
    }

    (*out_prop) = it->second;
  }

  DCOUT("Prop found: " << prop_name
                       << ", ty = " << out_prop->value_type_name());
  return true;
}